

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

string * __thiscall
kaitai::kstream::read_bytes_abi_cxx11_(string *__return_storage_ptr__,kstream *this,streamsize len)

{
  istream *piVar1;
  runtime_error *this_00;
  reference pvVar2;
  allocator<char> local_61;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  allocator_type local_39;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> result;
  streamsize len_local;
  kstream *this_local;
  
  result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = len;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_38,len,&local_39);
  std::allocator<char>::~allocator(&local_39);
  if ((long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"read_bytes: requested a negative amount");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0 < (long)result.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_) {
    piVar1 = this->m_io;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_38,0);
    std::istream::read((char *)piVar1,(long)pvVar2);
  }
  local_58._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_38);
  local_60._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)__return_storage_ptr__,local_58,local_60,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::read_bytes(std::streamsize len) {
    std::vector<char> result(len);

    // NOTE: streamsize type is signed, negative values are only *supposed* to not be used.
    // http://en.cppreference.com/w/cpp/io/streamsize
    if (len < 0) {
        throw std::runtime_error("read_bytes: requested a negative amount");
    }

    if (len > 0) {
        m_io->read(&result[0], len);
    }

    return std::string(result.begin(), result.end());
}